

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_arithmetic.c
# Opt level: O3

t_int * times_perform(t_int *w)

{
  t_int tVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  
  tVar1 = w[4];
  if ((int)tVar1 != 0) {
    lVar2 = w[3];
    lVar3 = w[1];
    lVar4 = w[2];
    lVar5 = 0;
    do {
      *(float *)(lVar2 + lVar5 * 4) = *(float *)(lVar3 + lVar5 * 4) * *(float *)(lVar4 + lVar5 * 4);
      lVar5 = lVar5 + 1;
    } while ((int)tVar1 != (int)lVar5);
  }
  return w + 5;
}

Assistant:

t_int *times_perform(t_int *w)
{
    t_sample *in1 = (t_sample *)(w[1]);
    t_sample *in2 = (t_sample *)(w[2]);
    t_sample *out = (t_sample *)(w[3]);
    int n = (int)(w[4]);
    while (n--) *out++ = *in1++ * *in2++;
    return (w+5);
}